

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Maybe<kj::AutoCloseFd> * __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenFileInternal
          (Maybe<kj::AutoCloseFd> *__return_storage_ptr__,DiskHandle *this,PathPtr path,
          WriteMode mode,bool append)

{
  WriteMode WVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int code;
  char *pcVar7;
  PathPtr PVar8;
  AutoCloseFd result;
  PathPtr path_local;
  String filename;
  
  path_local.parts.size_ = path.parts.size_;
  path_local.parts.ptr = path.parts.ptr;
  uVar4 = (mode & CREATE) << 6;
  uVar5 = uVar4 | 0x80002;
  if ((mode & MODIFY) == 0) {
    if ((mode & CREATE) == 0) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    uVar5 = uVar4 | 0x80082;
  }
  uVar4 = uVar5 | 0x400;
  if (!append) {
    uVar4 = uVar5;
  }
  PathPtr::toString(&filename,&path_local,false);
  do {
    pcVar7 = "";
    if (filename.content.size_ != 0) {
      pcVar7 = filename.content.ptr;
    }
    iVar6 = openat((this->fd).fd,pcVar7,uVar4);
    if (-1 < iVar6) {
      code = 0;
      break;
    }
    code = _::Debug::getOsErrorNumber(false);
  } while (code == -1);
  if (code < 0x11) {
    if (code == 0) {
      result.fd = iVar6;
      UnwindDetector::UnwindDetector(&result.unwindDetector);
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.fd = result.fd;
      UnwindDetector::UnwindDetector(&(__return_storage_ptr__->ptr).field_1.value.unwindDetector);
      result.fd = -1;
      AutoCloseFd::~AutoCloseFd(&result);
      goto LAB_003685ed;
    }
    if (code == 2) {
      if ((mode & CREATE) == 0) {
LAB_003685a6:
        (__return_storage_ptr__->ptr).isSet = false;
      }
      else {
        if (((mode & CREATE_PARENT) != 0) && (path_local.parts.size_ != 0)) {
          PVar8 = PathPtr::parent(&path_local);
          bVar3 = tryMkdir(this,PVar8,CREATE_PARENT|MODIFY|CREATE,true);
          if (bVar3) {
            PVar8.parts.size_ = path_local.parts.size_;
            PVar8.parts.ptr = path_local.parts.ptr;
            tryOpenFileInternal(__return_storage_ptr__,this,PVar8,mode & ~CREATE_PARENT,append);
            goto LAB_003685ed;
          }
        }
        if ((mode & MODIFY) == 0) {
          pcVar7 = filename.content.ptr;
          if (filename.content.size_ == 0) {
            pcVar7 = "";
          }
          iVar6 = faccessat((this->fd).fd,pcVar7,0,0x100);
          if (-1 < iVar6) goto LAB_003685a6;
        }
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
                  ((Fault *)&result,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x401,FAILED,(char *)0x0,"\"parent is not a directory\", path",
                   (char (*) [26])"parent is not a directory",&path_local);
        (__return_storage_ptr__->ptr).isSet = false;
        _::Debug::Fault::~Fault((Fault *)&result);
      }
      goto LAB_003685ed;
    }
  }
  else {
    if (code == 0x11) {
      WVar1 = mode & MODIFY;
    }
    else {
      if (code != 0x14) goto LAB_003685ab;
      WVar1 = mode & CREATE;
    }
    if (WVar1 == 0) goto LAB_003685a6;
  }
LAB_003685ab:
  _::Debug::Fault::Fault<int,kj::PathPtr&>
            ((Fault *)&result,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x414,code,"openat(fd, path, O_RDWR | ...)","path",&path_local);
  (__return_storage_ptr__->ptr).isSet = false;
  _::Debug::Fault::~Fault((Fault *)&result);
LAB_003685ed:
  sVar2 = filename.content.size_;
  pcVar7 = filename.content.ptr;
  if (filename.content.ptr != (char *)0x0) {
    filename.content.ptr = (char *)0x0;
    filename.content.size_ = 0;
    (**(filename.content.disposer)->_vptr_ArrayDisposer)
              (filename.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<AutoCloseFd> tryOpenFileInternal(PathPtr path, WriteMode mode, bool append) const {
    uint flags = O_RDWR | MAYBE_O_CLOEXEC;
    mode_t acl = 0666;
    if (has(mode, WriteMode::CREATE)) {
      flags |= O_CREAT;
    }
    if (!has(mode, WriteMode::MODIFY)) {
      if (!has(mode, WriteMode::CREATE)) {
        // Neither CREATE nor MODIFY -- impossible to satisfy preconditions.
        return nullptr;
      }
      flags |= O_EXCL;
    }
    if (append) {
      flags |= O_APPEND;
    }
    if (has(mode, WriteMode::EXECUTABLE)) {
      acl = 0777;
    }
    if (has(mode, WriteMode::PRIVATE)) {
      acl &= 0700;
    }

    auto filename = path.toString();

    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(fd, filename.cStr(), flags, acl)) {
      case ENOENT:
        if (has(mode, WriteMode::CREATE)) {
          // Either:
          // - The file is a broken symlink.
          // - A parent directory didn't exist.
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryOpenFileInternal(path, mode - WriteMode::CREATE_PARENT, append);
          }

          // Check for broken link.
          if (!has(mode, WriteMode::MODIFY) &&
              faccessat(fd, filename.cStr(), F_OK, AT_SYMLINK_NOFOLLOW) >= 0) {
            // Yep. We treat this as already-exists, which means in CREATE-only mode this is a
            // simple failure.
            return nullptr;
          }

          KJ_FAIL_REQUIRE("parent is not a directory", path) { return nullptr; }
        } else {
          // MODIFY-only mode. ENOENT = doesn't exist = return null.
          return nullptr;
        }
      case ENOTDIR:
        if (!has(mode, WriteMode::CREATE)) {
          // MODIFY-only mode. ENOTDIR = parent not a directory = doesn't exist = return null.
          return nullptr;
        }
        goto failed;
      case EEXIST:
        if (!has(mode, WriteMode::MODIFY)) {
          // CREATE-only mode. EEXIST = already exists = return null.
          return nullptr;
        }
        goto failed;
      default:
      failed:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDWR | ...)", error, path) { return nullptr; }
    }

    kj::AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return kj::mv(result);
  }